

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.cpp
# Opt level: O0

string * fs_type_linux_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view path_00;
  int iVar1;
  const_pointer __file;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  allocator<char> local_da;
  allocator<char> local_d9;
  allocator<char> local_d8;
  allocator<char> local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5;
  allocator<char> local_d4;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  allocator<char> local_d0;
  allocator<char> local_cf;
  allocator<char> local_ce;
  allocator<char> local_cd [20];
  allocator<char> local_b9;
  string_view local_b8;
  size_t local_a8;
  char *local_a0;
  undefined1 local_98 [8];
  statfs s;
  string_view path_local;
  
  s.f_spare[3] = path._M_len;
  __file = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)(s.f_spare + 3));
  iVar1 = statfs(__file,(statfs *)local_98);
  if (iVar1 == 0) {
    if (local_98 == (undefined1  [8])0x6969) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"nfs",&local_d2);
      std::allocator<char>::~allocator(&local_d2);
    }
    else if (local_98 == (undefined1  [8])0x9fa0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"procfs",&local_d3);
      std::allocator<char>::~allocator(&local_d3);
    }
    else if (local_98 == (undefined1  [8])0xef53) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"ext4",&local_ce);
      std::allocator<char>::~allocator(&local_ce);
    }
    else if (local_98 == (undefined1  [8])0x1021994) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"tmpfs",&local_d6);
      std::allocator<char>::~allocator(&local_d6);
    }
    else if (local_98 == (undefined1  [8])0x1021997) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"v9fs",&local_d9);
      std::allocator<char>::~allocator(&local_d9);
    }
    else if (local_98 == (undefined1  [8])0x15013346) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"udf",&local_d8);
      std::allocator<char>::~allocator(&local_d8);
    }
    else if (local_98 == (undefined1  [8])0x2011bab0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"exfat",&local_cf);
      std::allocator<char>::~allocator(&local_cf);
    }
    else if (local_98 == (undefined1  [8])0x58465342) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"xfs",&local_da);
      std::allocator<char>::~allocator(&local_da);
    }
    else if (local_98 == (undefined1  [8])0x62656572) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"sysfs",&local_d5);
      std::allocator<char>::~allocator(&local_d5);
    }
    else if (local_98 == (undefined1  [8])0x64626720) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"debugfs",local_cd);
      std::allocator<char>::~allocator(local_cd);
    }
    else if (local_98 == (undefined1  [8])0x65735546) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"fuse",&local_d1);
      std::allocator<char>::~allocator(&local_d1);
    }
    else if (local_98 == (undefined1  [8])0x73717368) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"squashfs",&local_d4);
      std::allocator<char>::~allocator(&local_d4);
    }
    else if (local_98 == (undefined1  [8])0x74726163) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"tracefs",&local_d7);
      std::allocator<char>::~allocator(&local_d7);
    }
    else if (local_98 == (undefined1  [8])0x9123683e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"btrfs",&local_b9);
      std::allocator<char>::~allocator(&local_b9);
    }
    else if (local_98 == (undefined1  [8])0xf2f52010) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"f2fs",&local_d0);
      std::allocator<char>::~allocator(&local_d0);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR:fs_filesystem_type ");
      __str._M_str = path._M_str;
      __str._M_len = s.f_spare[3];
      pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,__str);
      poVar2 = std::operator<<((ostream *)pbVar3," unknown type ID: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(long)local_98);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    local_a8 = s.f_spare[3];
    local_a0 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,"fs_type_linux");
    path_00._M_str = local_a0;
    path_00._M_len = local_a8;
    fs_print_error(path_00,local_b8);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string fs_type_linux(std::string_view path)
{
  struct statfs s;

  if(statfs(path.data(), &s)) {
    fs_print_error(path, __func__);
    return {};
  }

#ifndef BTRFS_SUPER_MAGIC
#define BTRFS_SUPER_MAGIC 0x9123683E
#endif
#ifndef DEBUGFS_MAGIC
#define DEBUGFS_MAGIC 0x64626720
#endif
#ifndef FUSE_SUPER_MAGIC
#define FUSE_SUPER_MAGIC 0x65735546
#endif
#ifndef EXFAT_SUPER_MAGIC
#define EXFAT_SUPER_MAGIC 0x2011BAB0
#endif
#ifndef F2FS_SUPER_MAGIC
#define F2FS_SUPER_MAGIC 0xF2F52010
#endif
#ifndef PROC_SUPER_MAGIC
#define PROC_SUPER_MAGIC 0x9FA0
#endif
#ifndef SYSFS_MAGIC
#define SYSFS_MAGIC 0x62656572
#endif
#ifndef TRACEFS_MAGIC
#define TRACEFS_MAGIC 0x74726163
#endif
#ifndef UDF_SUPER_MAGIC
#define UDF_SUPER_MAGIC 0x15013346
#endif
#ifndef XFS_SUPER_MAGIC
#define XFS_SUPER_MAGIC 0x58465342
#endif

  switch (s.f_type) {
    case BTRFS_SUPER_MAGIC: return "btrfs";
    case DEBUGFS_MAGIC: return "debugfs";
    case EXT4_SUPER_MAGIC: return "ext4";
    case EXFAT_SUPER_MAGIC: return "exfat";
    case F2FS_SUPER_MAGIC: return "f2fs";
    case FUSE_SUPER_MAGIC: return "fuse";
    case NFS_SUPER_MAGIC: return "nfs";
    case PROC_SUPER_MAGIC: return "procfs";
    case SQUASHFS_MAGIC: return "squashfs";
    case SYSFS_MAGIC: return "sysfs";
    case TMPFS_MAGIC: return "tmpfs";
    case TRACEFS_MAGIC: return "tracefs";
    case UDF_SUPER_MAGIC: return "udf";
    case V9FS_MAGIC: return "v9fs";
    // used for WSL
    // https://devblogs.microsoft.com/commandline/whats-new-for-wsl-in-windows-10-version-1903/
    case XFS_SUPER_MAGIC: return "xfs";

    default:
      std::cerr << "ERROR:fs_filesystem_type " << path << " unknown type ID: " << s.f_type << "\n";
      return {};
  }
}